

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O1

DdNode * cuddBddIteRecur(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  DdNode *pDVar5;
  DdHalfWord *pDVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  ulong uVar10;
  DdNode *pDVar11;
  DdHalfWord index;
  uint uVar12;
  DdNode *pDVar13;
  bool bVar14;
  bool bVar15;
  
  pDVar5 = dd->one;
  if (pDVar5 == f) {
    return g;
  }
  pDVar8 = (DdNode *)((ulong)pDVar5 ^ 1);
  if (pDVar8 == f) {
    return h;
  }
  if (g == f || pDVar5 == g) {
    if (pDVar8 == h) {
      return f;
    }
    f = (DdNode *)((ulong)f ^ 1);
    pDVar13 = (DdNode *)((ulong)h ^ 1);
  }
  else {
    pDVar13 = (DdNode *)((ulong)g ^ 1);
    if ((pDVar13 == f) || (pDVar8 == g)) {
      f = (DdNode *)((ulong)f ^ 1);
      g = h;
      if (pDVar5 == h) {
        return f;
      }
LAB_007e9455:
      pDVar5 = cuddBddAndRecur(dd,f,g);
      return pDVar5;
    }
    if ((h == f) || (pDVar8 == h)) goto LAB_007e9455;
    if ((pDVar5 != h) && ((DdNode *)((ulong)h ^ 1) != f)) {
      if (g == h) {
        return g;
      }
      if ((DdNode *)((ulong)h ^ 1) == g) {
        pDVar5 = cuddBddXorRecur(dd,f,h);
        return pDVar5;
      }
      bVar14 = ((ulong)f & 1) != 0;
      pDVar13 = h;
      pDVar11 = f;
      pDVar9 = g;
      if (bVar14) {
        pDVar11 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
        pDVar13 = g;
        pDVar9 = h;
      }
      bVar15 = ((ulong)pDVar9 & 1) != 0;
      pDVar7 = pDVar9;
      if (bVar15) {
        pDVar13 = (DdNode *)((ulong)pDVar13 ^ 1);
        pDVar7 = (DdNode *)((ulong)pDVar9 & 0xfffffffffffffffe);
      }
      uVar10 = (ulong)bVar15;
      if (bVar15 || bVar14) {
        f = pDVar11;
        h = pDVar13;
        g = pDVar7;
      }
      piVar4 = dd->perm;
      uVar1 = piVar4[pDVar11->index];
      uVar2 = piVar4[pDVar7->index];
      uVar3 = piVar4[*(uint *)((ulong)pDVar13 & 0xfffffffffffffffe)];
      uVar12 = uVar2;
      if (uVar3 < uVar2) {
        uVar12 = uVar3;
      }
      if (((uVar1 < uVar12) && ((f->type).kids.T == pDVar5)) && ((f->type).kids.E == pDVar8)) {
        pDVar5 = cuddUniqueInter(dd,f->index,g,h);
        uVar10 = (ulong)(pDVar5 != (DdNode *)0x0 & (byte)pDVar9);
      }
      else {
        pDVar5 = cuddCacheLookup(dd,0xe,f,g,h);
        if (pDVar5 == (DdNode *)0x0) {
          index = 0xffffffff;
          pDVar8 = f;
          pDVar5 = f;
          if (uVar1 <= uVar12) {
            index = f->index;
            pDVar5 = (f->type).kids.T;
            pDVar8 = (f->type).kids.E;
            uVar12 = uVar1;
          }
          pDVar11 = g;
          pDVar13 = g;
          if (uVar2 == uVar12) {
            index = g->index;
            pDVar13 = (g->type).kids.T;
            pDVar11 = (g->type).kids.E;
          }
          pDVar7 = h;
          pDVar9 = h;
          if (uVar3 == uVar12) {
            pDVar6 = (DdHalfWord *)((ulong)h & 0xfffffffffffffffe);
            index = *pDVar6;
            pDVar9 = *(DdNode **)(pDVar6 + 4);
            pDVar7 = *(DdNode **)(pDVar6 + 6);
            if (((ulong)h & 1) != 0) {
              pDVar9 = (DdNode *)((ulong)pDVar9 ^ 1);
              pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
            }
          }
          pDVar5 = cuddBddIteRecur(dd,pDVar5,pDVar13,pDVar9);
          if (pDVar5 != (DdNode *)0x0) {
            piVar4 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + 1;
            pDVar8 = cuddBddIteRecur(dd,pDVar8,pDVar11,pDVar7);
            if (pDVar8 != (DdNode *)0x0) {
              piVar4 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
              *piVar4 = *piVar4 + 1;
              pDVar13 = pDVar5;
              if (pDVar5 != pDVar8) {
                pDVar13 = cuddUniqueInter(dd,index,pDVar5,pDVar8);
              }
              if (pDVar13 != (DdNode *)0x0) {
                piVar4 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
                *piVar4 = *piVar4 + -1;
                piVar4 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
                *piVar4 = *piVar4 + -1;
                cuddCacheInsert(dd,0xe,f,g,h,pDVar13);
                return (DdNode *)(uVar10 ^ (ulong)pDVar13);
              }
              Cudd_IterDerefBdd(dd,pDVar5);
              pDVar5 = pDVar8;
            }
            Cudd_IterDerefBdd(dd,pDVar5);
          }
          return (DdNode *)0x0;
        }
      }
      goto LAB_007e9380;
    }
  }
  pDVar5 = cuddBddAndRecur(dd,f,pDVar13);
  uVar10 = (ulong)(pDVar5 != (DdNode *)0x0);
LAB_007e9380:
  return (DdNode *)(uVar10 ^ (ulong)pDVar5);
}

Assistant:

DdNode *
cuddBddIteRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode       *one, *zero, *res;
    DdNode       *r, *Fv, *Fnv, *Gv, *Gnv, *H, *Hv, *Hnv, *t, *e;
    unsigned int topf, topg, toph, v;
    int          index = -1;
    int          comple;

    statLine(dd);
    /* Terminal cases. */

    /* One variable cases. */
    if (f == (one = DD_ONE(dd)))        /* ITE(1,G,H) = G */
        return(g);
    
    if (f == (zero = Cudd_Not(one)))    /* ITE(0,G,H) = H */
        return(h);
    
    /* From now on, f is known not to be a constant. */
    if (g == one || f == g) {   /* ITE(F,F,H) = ITE(F,1,H) = F + H */
        if (h == zero) {        /* ITE(F,1,0) = F */
            return(f);
        } else {
            res = cuddBddAndRecur(dd,Cudd_Not(f),Cudd_Not(h));
            return(Cudd_NotCond(res,res != NULL));
        }
    } else if (g == zero || f == Cudd_Not(g)) { /* ITE(F,!F,H) = ITE(F,0,H) = !F * H */
        if (h == one) {         /* ITE(F,0,1) = !F */
            return(Cudd_Not(f));
        } else {
            res = cuddBddAndRecur(dd,Cudd_Not(f),h);
            return(res);
        }
    }
    if (h == zero || f == h) {    /* ITE(F,G,F) = ITE(F,G,0) = F * G */
        res = cuddBddAndRecur(dd,f,g);
        return(res);
    } else if (h == one || f == Cudd_Not(h)) { /* ITE(F,G,!F) = ITE(F,G,1) = !F + G */
        res = cuddBddAndRecur(dd,f,Cudd_Not(g));
        return(Cudd_NotCond(res,res != NULL));
    }

    /* Check remaining one variable case. */
    if (g == h) {               /* ITE(F,G,G) = G */
        return(g);
    } else if (g == Cudd_Not(h)) { /* ITE(F,G,!G) = F <-> G */
        res = cuddBddXorRecur(dd,f,h);
        return(res);
    }
    
    /* From here, there are no constants. */
    comple = bddVarToCanonicalSimple(dd, &f, &g, &h, &topf, &topg, &toph);

    /* f & g are now regular pointers */

    v = ddMin(topg, toph);

    /* A shortcut: ITE(F,G,H) = (v,G,H) if F = (v,1,0), v < top(G,H). */
    if (topf < v && cuddT(f) == one && cuddE(f) == zero) {
        r = cuddUniqueInter(dd, (int) f->index, g, h);
        return(Cudd_NotCond(r,comple && r != NULL));
    }

    /* Check cache. */
    r = cuddCacheLookup(dd, DD_BDD_ITE_TAG, f, g, h);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple));
    }

    /* Compute cofactors. */
    if (topf <= v) {
        v = ddMin(topf, v);     /* v = top_var(F,G,H) */
        index = f->index;
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topg == v) {
        index = g->index;
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }
    if (toph == v) {
        H = Cudd_Regular(h);
        index = H->index;
        Hv = cuddT(H); Hnv = cuddE(H);
        if (Cudd_IsComplement(h)) {
            Hv = Cudd_Not(Hv);
            Hnv = Cudd_Not(Hnv);
        }
    } else {
        Hv = Hnv = h;
    }

    /* Recursive step. */
    t = cuddBddIteRecur(dd,Fv,Gv,Hv);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddBddIteRecur(dd,Fnv,Gnv,Hnv);
    if (e == NULL) {
        Cudd_IterDerefBdd(dd,t);
        return(NULL);
    }
    cuddRef(e);

    r = (t == e) ? t : cuddUniqueInter(dd,index,t,e);
    if (r == NULL) {
        Cudd_IterDerefBdd(dd,t);
        Cudd_IterDerefBdd(dd,e);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);

    cuddCacheInsert(dd, DD_BDD_ITE_TAG, f, g, h, r);
    return(Cudd_NotCond(r,comple));

}